

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void * rw::mustrealloc_h(void *p,size_t sz,uint32 hint)

{
  void *pvVar1;
  void *ret;
  uint32 hint_local;
  size_t sz_local;
  void *p_local;
  
  pvVar1 = (void *)(*DAT_00168630)(p,sz,hint);
  if ((pvVar1 == (void *)0x0) && (sz != 0)) {
    fprintf(_stderr,"Error: out of memory\n");
    exit(1);
  }
  return pvVar1;
}

Assistant:

void *mustrealloc_h(void *p, size_t sz, uint32 hint)
{
	void *ret;
	ret = Engine::memfuncs.rwrealloc(p, sz, hint);
	if(ret || sz == 0)
		return ret;
	fprintf(stderr, "Error: out of memory\n");
	exit(1);
	return nil;
}